

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  value_type vVar4;
  reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  EXRHeader *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  bool bVar8;
  int ret;
  string e;
  uint part_no;
  uchar *part_number_addr;
  uint dx_1;
  uint dy_1;
  uint l_1;
  OffsetData *offset_data_1;
  size_t i_2;
  tinyexr_uint64 offset_1;
  uint dx;
  uint dy;
  uint l;
  int num_blocks;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  tinyexr_uint64 offset;
  size_t c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *offset_table;
  OffsetData *offset_data;
  size_t i_1;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  char *marker;
  uint i;
  size_t total_header_size;
  string *in_stack_000007c0;
  size_t in_stack_000007c8;
  uchar *in_stack_000007d0;
  OffsetData *in_stack_000007d8;
  EXRHeader *in_stack_000007e0;
  EXRImage *in_stack_000007e8;
  string *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  EXRHeader *in_stack_fffffffffffffd30;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *in_stack_fffffffffffffd50;
  allocator *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  EXRHeader *exr_header;
  OffsetData *offset_data_00;
  string local_228 [39];
  allocator local_201;
  string local_200 [36];
  uint local_1dc;
  uint *local_1d8;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  reference local_1c0;
  ulong local_1b8;
  allocator local_1a9;
  string local_1a8 [32];
  ulong local_188;
  uint local_180;
  uint local_17c;
  uint local_178;
  allocator local_171;
  string local_170 [36];
  int local_14c;
  undefined1 local_148 [48];
  uint local_118;
  allocator local_111;
  string local_110 [32];
  ulong local_f0;
  ulong local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e0;
  reference local_d8;
  ulong local_d0;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> local_c8;
  ulong *local_b0;
  allocator local_a1;
  string local_a0 [36];
  uint local_7c;
  long local_78;
  allocator local_59;
  string local_58 [40];
  ulong local_30;
  EXRHeader *local_28;
  uint local_1c;
  long local_18;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_EDX == 0)) ||
     ((in_RCX == (EXRHeader *)0x0 || (in_R8 < 9)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,"Invalid argument for LoadEXRMultipartImageFromMemory()",&local_59);
    tinyexr::SetErrorMessage
              ((string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               (char **)in_stack_fffffffffffffd18);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_4 = -3;
  }
  else {
    local_78 = 0;
    for (local_7c = 0; local_7c < in_EDX; local_7c = local_7c + 1) {
      if (*(int *)(*(long *)(in_RSI + (ulong)local_7c * 8) + 0x58) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"EXRHeader variable is not initialized.",&local_a1);
        tinyexr::SetErrorMessage
                  ((string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (char **)in_stack_fffffffffffffd18);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        return -3;
      }
      local_78 = (ulong)*(uint *)(*(long *)(in_RSI + (ulong)local_7c * 8) + 0x58) + local_78;
    }
    local_b0 = (ulong *)((long)in_RCX->screen_window_center + local_78 + -0x1f);
    local_30 = in_R8;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::vector
              ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)0x456523);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    for (local_d0 = 0; local_d0 < local_1c; local_d0 = local_d0 + 1) {
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::size(&local_c8);
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)
                 in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
      local_d8 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::back
                           ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)
                            CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      if ((*(int *)(*(long *)(local_18 + local_d0 * 8) + 0x38) == 0) ||
         (*(int *)(*(long *)(local_18 + local_d0 * 8) + 0x44) == 0)) {
        tinyexr::InitSingleResolutionOffsets
                  ((OffsetData *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (size_t)in_stack_fffffffffffffd18);
        pvVar2 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](&local_d8->offsets,0);
        local_e0 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pvVar2,0);
        for (local_e8 = 0; uVar7 = local_e8,
            sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_e0),
            uVar7 < sVar3; local_e8 = local_e8 + 1) {
          local_f0 = *local_b0;
          tinyexr::swap8(&local_f0);
          if (local_30 <= local_f0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_110,"Invalid offset size in EXR header chunks.",&local_111);
            tinyexr::SetErrorMessage
                      ((string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       (char **)in_stack_fffffffffffffd18);
            std::__cxx11::string::~string(local_110);
            std::allocator<char>::~allocator((allocator<char> *)&local_111);
            local_4 = -4;
            local_118 = 1;
            goto LAB_00457032;
          }
          vVar4 = local_f0 + 4;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_e0,local_e8);
          *pvVar5 = vVar4;
          local_b0 = local_b0 + 1;
        }
      }
      else {
        exr_header = (EXRHeader *)(local_148 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x4567f0);
        offset_data_00 = (OffsetData *)local_148;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x456802);
        tinyexr::PrecalculateTileInfo
                  (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        in_stack_fffffffffffffd84 =
             tinyexr::InitTileOffsets
                       (offset_data_00,exr_header,
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd78);
        bVar8 = in_stack_fffffffffffffd84 != *(int *)(*(long *)(local_18 + local_d0 * 8) + 0x34);
        local_14c = in_stack_fffffffffffffd84;
        if (bVar8) {
          in_stack_fffffffffffffd78 = &local_171;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_170,"Invalid offset table size.",in_stack_fffffffffffffd78);
          tinyexr::SetErrorMessage
                    ((string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     (char **)in_stack_fffffffffffffd18);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          local_4 = -4;
        }
        local_118 = (uint)bVar8;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
        if (local_118 != 0) goto LAB_00457032;
        for (local_178 = 0; uVar7 = (ulong)local_178,
            sVar3 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::size(&local_d8->offsets), uVar7 < sVar3; local_178 = local_178 + 1) {
          local_17c = 0;
          while( true ) {
            uVar7 = (ulong)local_17c;
            pvVar2 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[](&local_d8->offsets,(ulong)local_178);
            sVar3 = std::
                    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::size(pvVar2);
            if (sVar3 <= uVar7) break;
            local_180 = 0;
            while( true ) {
              uVar7 = (ulong)local_180;
              pvVar2 = std::
                       vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ::operator[](&local_d8->offsets,(ulong)local_178);
              pvVar6 = std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::operator[](pvVar2,(ulong)local_17c);
              sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar6);
              if (sVar3 <= uVar7) break;
              local_188 = *local_b0;
              tinyexr::swap8(&local_188);
              if (local_30 <= local_188) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1a8,"Invalid offset size in EXR header chunks.",&local_1a9);
                tinyexr::SetErrorMessage
                          ((string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                           (char **)in_stack_fffffffffffffd18);
                std::__cxx11::string::~string(local_1a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
                local_4 = -4;
                local_118 = 1;
                goto LAB_00457032;
              }
              vVar4 = local_188 + 4;
              pvVar2 = std::
                       vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ::operator[](&local_d8->offsets,(ulong)local_178);
              pvVar6 = std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::operator[](pvVar2,(ulong)local_17c);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (pvVar6,(ulong)local_180);
              *pvVar5 = vVar4;
              local_b0 = local_b0 + 1;
              local_180 = local_180 + 1;
            }
            local_17c = local_17c + 1;
          }
        }
      }
    }
    for (local_1b8 = 0; local_1b8 < local_1c; local_1b8 = local_1b8 + 1) {
      local_1c0 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::operator[]
                            (&local_c8,local_1b8);
      local_1c4 = 0;
      while( true ) {
        uVar7 = (ulong)local_1c4;
        sVar3 = std::
                vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ::size(&local_1c0->offsets);
        if (sVar3 <= uVar7) break;
        local_1c8 = 0;
        while( true ) {
          uVar7 = (ulong)local_1c8;
          pvVar2 = std::
                   vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ::operator[](&local_1c0->offsets,(ulong)local_1c4);
          sVar3 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size(pvVar2);
          if (sVar3 <= uVar7) break;
          local_1cc = 0;
          while( true ) {
            uVar7 = (ulong)local_1cc;
            pvVar2 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[](&local_1c0->offsets,(ulong)local_1c4);
            pvVar6 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](pvVar2,(ulong)local_1c8);
            sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar6);
            if (sVar3 <= uVar7) break;
            in_stack_fffffffffffffd30 = local_28;
            pvVar2 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[](&local_1c0->offsets,(ulong)local_1c4);
            pvVar6 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](pvVar2,(ulong)local_1c8);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (pvVar6,(ulong)local_1cc);
            local_1d8 = (uint *)((long)in_stack_fffffffffffffd30->screen_window_center +
                                (*pvVar5 - 0x2c));
            local_1dc = *local_1d8;
            tinyexr::swap4(&local_1dc);
            if (local_1dc != local_1b8) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_200,"Invalid `part number\' in EXR header chunks.",&local_201);
              tinyexr::SetErrorMessage
                        ((string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                         (char **)in_stack_fffffffffffffd18);
              std::__cxx11::string::~string(local_200);
              std::allocator<char>::~allocator((allocator<char> *)&local_201);
              local_4 = -4;
              local_118 = 1;
              goto LAB_00457032;
            }
            local_1cc = local_1cc + 1;
          }
          local_1c8 = local_1c8 + 1;
        }
        local_1c4 = local_1c4 + 1;
      }
      in_stack_fffffffffffffd18 = local_228;
      std::__cxx11::string::string(in_stack_fffffffffffffd18);
      iVar1 = tinyexr::DecodeChunk
                        (in_stack_000007e8,in_stack_000007e0,in_stack_000007d8,in_stack_000007d0,
                         in_stack_000007c8,in_stack_000007c0);
      in_stack_fffffffffffffd24 = iVar1;
      if (iVar1 == 0) {
        local_118 = 0;
      }
      else {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          tinyexr::SetErrorMessage
                    ((string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     (char **)in_stack_fffffffffffffd18);
        }
        local_118 = 1;
        local_4 = iVar1;
      }
      std::__cxx11::string::~string(local_228);
      if (local_118 != 0) goto LAB_00457032;
    }
    local_4 = 0;
    local_118 = 1;
LAB_00457032:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector
              ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)
               in_stack_fffffffffffffd30);
  }
  return local_4;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8 
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identitical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}